

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O1

wchar_t * uriParsePortW(UriParserStateW *state,wchar_t *first,wchar_t *afterLast)

{
  UriParserStateW *pUVar1;
  
  for (; (pUVar1 = (UriParserStateW *)first, state < first &&
         (pUVar1 = state, (uint)(*(wchar_t *)&state->uri + L'\xffffffd0') < 10));
      state = (UriParserStateW *)((long)&state->uri + 4)) {
  }
  return (wchar_t *)pUVar1;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParsePort)(URI_TYPE(ParserState) * state, const URI_CHAR * first, const URI_CHAR * afterLast) {
	if (first >= afterLast) {
		return afterLast;
	}

	switch (*first) {
	case URI_SET_DIGIT:
		return URI_FUNC(ParsePort)(state, first + 1, afterLast);

	default:
		return first;
	}
}